

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  __m128 _outp_2;
  __m128 _b_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_256;
  __m128 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_mul op;
  int local_344;
  int local_2d0;
  undefined8 *local_2c0;
  float *local_2b8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined4 uStack_a4;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  
  local_2c0 = in_RDX;
  local_2b8 = in_RSI;
  if (in_R8D == 8) {
    local_2d0 = 0;
    uVar5 = *in_RDI;
    uVar6 = in_RDI[1];
    uVar7 = in_RDI[2];
    uVar8 = in_RDI[3];
    for (; local_2d0 < in_ECX; local_2d0 = local_2d0 + 1) {
      fVar1 = *local_2b8;
      auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
      local_c0 = (float)uVar5;
      fStack_bc = (float)((ulong)uVar5 >> 0x20);
      fStack_b8 = (float)uVar6;
      fStack_b4 = (float)((ulong)uVar6 >> 0x20);
      fStack_b0 = (float)uVar7;
      fStack_ac = (float)((ulong)uVar7 >> 0x20);
      fStack_a8 = (float)uVar8;
      uStack_a4 = (undefined4)((ulong)uVar8 >> 0x20);
      local_e0 = auVar4._0_4_;
      fStack_dc = auVar4._4_4_;
      fStack_d8 = auVar4._8_4_;
      fStack_d4 = auVar4._12_4_;
      fStack_d0 = auVar3._0_4_;
      fStack_cc = auVar3._4_4_;
      fStack_c8 = auVar3._8_4_;
      *local_2c0 = CONCAT44(fStack_bc * fStack_dc,local_c0 * local_e0);
      local_2c0[1] = CONCAT44(fStack_b4 * fStack_d4,fStack_b8 * fStack_d8);
      local_2c0[2] = CONCAT44(fStack_ac * fStack_cc,fStack_b0 * fStack_d0);
      local_2c0[3] = CONCAT44(uStack_a4,fStack_a8 * fStack_c8);
      local_2b8 = local_2b8 + 1;
      local_2c0 = local_2c0 + 4;
    }
  }
  if (in_R8D == 4) {
    local_344 = 0;
    uVar5 = *in_RDI;
    uVar6 = in_RDI[1];
    while( true ) {
      local_80 = (float)uVar5;
      fStack_7c = (float)((ulong)uVar5 >> 0x20);
      fStack_78 = (float)uVar6;
      fStack_74 = (float)((ulong)uVar6 >> 0x20);
      if (in_ECX <= local_344 + 1) break;
      fVar1 = *local_2b8;
      fVar2 = local_2b8[1];
      *local_2c0 = CONCAT44(fStack_7c * fVar1,local_80 * fVar1);
      local_2c0[1] = CONCAT44(fStack_74 * fVar1,fStack_78 * fVar1);
      local_2c0[2] = CONCAT44(fStack_7c * fVar2,local_80 * fVar2);
      local_2c0[3] = CONCAT44(fStack_74,fStack_78 * fVar2);
      local_2b8 = local_2b8 + 2;
      local_2c0 = local_2c0 + 4;
      local_344 = local_344 + 2;
    }
    for (; local_344 < in_ECX; local_344 = local_344 + 1) {
      fVar1 = *local_2b8;
      *local_2c0 = CONCAT44(fStack_7c * fVar1,local_80 * fVar1);
      local_2c0[1] = CONCAT44(fStack_74 * fVar1,fStack_78 * fVar1);
      local_2b8 = local_2b8 + 1;
      local_2c0 = local_2c0 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}